

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

HighsStatus __thiscall
HighsSparseMatrix::assessIndexBounds(HighsSparseMatrix *this,HighsLogOptions *log_options)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  HighsStatus HVar6;
  bool bVar7;
  
  bVar7 = this->format_ == kColwise;
  iVar2 = this->num_col_;
  if (bVar7) {
    iVar2 = this->num_row_;
  }
  iVar4 = this->num_row_;
  if (bVar7) {
    iVar4 = this->num_col_;
  }
  uVar3 = (ulong)(this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar4];
  HVar6 = kOk;
  if (1 < (long)uVar3) {
    piVar1 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = piVar1[1];
    if (iVar4 < iVar2 && -1 < iVar4) {
      uVar5 = 1;
      do {
        if ((2 - uVar3) + uVar5 == 1) {
          return kOk;
        }
        iVar4 = piVar1[uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while ((-1 < iVar4) && (iVar4 < iVar2));
      HVar6 = -(uint)(uVar5 < uVar3);
    }
    else {
      HVar6 = kError;
      uVar5 = 1;
    }
    highsLogUser(log_options,kError,"Matrix index[%d] = %d is not in legal range of [0, %d)\n",uVar5
                );
  }
  return HVar6;
}

Assistant:

HighsStatus HighsSparseMatrix::assessIndexBounds(
    const HighsLogOptions& log_options) {
  // Identify main dimensions
  HighsInt vec_dim;
  HighsInt num_vec;
  if (this->isColwise()) {
    vec_dim = this->num_row_;
    //    num_vec = this->num_col_;
  } else {
    vec_dim = this->num_col_;
    //    num_vec = this->num_row_;
  }
  HighsInt num_nz = this->numNz();
  for (HighsInt iEl = 1; iEl < num_nz; iEl++) {
    if (this->index_[iEl] < 0 || this->index_[iEl] >= vec_dim) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Matrix index[%d] = %d is not in legal range of [0, %d)\n",
                   int(iEl), int(this->index_[iEl]), vec_dim);
      return HighsStatus::kError;
    }
  }
  return HighsStatus::kOk;
}